

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testinplacetext.cpp
# Opt level: O3

int inplace_text_resetter_proc(Am_Object *self)

{
  Am_Value *pAVar1;
  long *plVar2;
  Am_String string;
  Am_String AStack_18;
  
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)self,(ulong)Am_INPLACE_TEXT_INFO);
  plVar2 = (long *)Am_Value::operator_cast_to_void_(pAVar1);
  if (plVar2 != (long *)0x0) {
    pAVar1 = (Am_Value *)Am_Object::Get((ushort)self,0xab);
    Am_String::Am_String(&AStack_18,pAVar1);
    (**(code **)(*plVar2 + 0x10))(plVar2,&AStack_18);
    Am_String::~Am_String(&AStack_18);
  }
  return 0;
}

Assistant:

Am_Define_Formula(int, inplace_text_resetter)
{
  Am_Text_Info *text_info =
      Am_Text_Info::Narrow((Am_Ptr)self.Get(Am_INPLACE_TEXT_INFO));

  if (!text_info)
    return 0;

  Am_String string = self.Get(Am_TEXT);
  text_info->Set_Text(string);
  return 0;
}